

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O0

bool QTestResult::reportResult
               (bool success,void *lhs,void *rhs,_func_char_ptr_void_ptr *lhsFormatter,
               _func_char_ptr_void_ptr *rhsFormatter,char *lhsExpr,char *rhsExpr,
               ComparisonOperation op,char *file,int line,char *failureMessage)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  code *in_RCX;
  char *in_RDX;
  char *in_RSI;
  byte in_DIL;
  code *in_R8;
  long in_R9;
  long in_FS_OFFSET;
  long in_stack_00000008;
  ComparisonOperation in_stack_00000010;
  char *in_stack_00000028;
  unique_ptr<const_char[],_std::default_delete<const_char[]>_> rhsPtr;
  unique_ptr<const_char[],_std::default_delete<const_char[]>_> lhsPtr;
  char msg [4096];
  char *in_stack_ffffffffffffef48;
  undefined4 in_stack_ffffffffffffef50;
  undefined4 in_stack_ffffffffffffef54;
  char *in_stack_ffffffffffffef58;
  undefined1 in_stack_ffffffffffffef66;
  undefined8 in_stack_ffffffffffffef90;
  int line_00;
  char *in_stack_ffffffffffffef98;
  undefined6 in_stack_ffffffffffffefe0;
  undefined1 in_stack_ffffffffffffefe7;
  char *in_stack_ffffffffffffefe8;
  undefined1 *maxMsgLen;
  char local_1008 [56];
  char *in_stack_fffffffffffff030;
  ComparisonOperation in_stack_fffffffffffff038;
  
  line_00 = (int)((ulong)in_stack_ffffffffffffef90 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DIL & 1;
  local_1008[0] = '\0';
  if (in_R9 == 0) {
    qt_assert("lhsExpr",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
              ,0x2bd);
  }
  if (in_stack_00000008 == 0) {
    qt_assert("rhsExpr",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
              ,0x2be);
  }
  iVar3 = QTestLog::verboseLevel();
  if (1 < iVar3) {
    pcVar4 = macroNameForOp(in_stack_00000010);
    snprintf(local_1008,0x1000,"%s(%s, %s)",pcVar4,in_R9,in_stack_00000008);
    QTestLog::info(in_stack_ffffffffffffefe8,in_stack_ffffffffffffef98,line_00);
  }
  if ((bVar2 & 1) == 0) {
    pcVar4 = &DAT_aaaaaaaaaaaaaaaa;
    (*in_RCX)(in_RSI);
    std::unique_ptr<char_const[],std::default_delete<char_const[]>>::
    unique_ptr<char_const*,std::default_delete<char_const[]>,void,bool>
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50),
               in_stack_ffffffffffffef48);
    maxMsgLen = &DAT_aaaaaaaaaaaaaaaa;
    (*in_R8)(in_RDX);
    std::unique_ptr<char_const[],std::default_delete<char_const[]>>::
    unique_ptr<char_const*,std::default_delete<char_const[]>,void,bool>
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50),
               in_stack_ffffffffffffef48);
    if (in_stack_00000028 == (char *)0x0) {
      in_stack_00000028 = failureMessageForOp(in_stack_00000010);
    }
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::get
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::get
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50));
    formatFailMessage(pcVar4,(size_t)maxMsgLen,
                      (char *)CONCAT17(in_stack_ffffffffffffefe7,
                                       CONCAT16(bVar2,in_stack_ffffffffffffefe0)),in_RSI,in_RDX,
                      (char *)in_RCX,in_stack_fffffffffffff030,in_stack_fffffffffffff038);
    bVar2 = checkStatement((bool)in_stack_ffffffffffffef66,in_stack_ffffffffffffef58,
                           (char *)CONCAT44(in_stack_ffffffffffffef54,in_stack_00000010),
                           (int)((ulong)in_stack_00000008 >> 0x20));
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::~unique_ptr
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffef54,in_stack_00000010));
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::~unique_ptr
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffef54,in_stack_00000010));
  }
  else {
    if (QTest::expectFailMode != 0) {
      pcVar4 = local_1008;
      pcVar5 = macroNameForOp(in_stack_00000010);
      snprintf(pcVar4,0x1000,"%s(%s, %s) returned TRUE unexpectedly.",pcVar5,in_R9,in_stack_00000008
              );
    }
    bVar2 = checkStatement((bool)in_stack_ffffffffffffef66,in_stack_ffffffffffffef58,
                           (char *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50),
                           (int)((ulong)in_stack_ffffffffffffef48 >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool QTestResult::reportResult(bool success, const void *lhs, const void *rhs,
                               const char *(*lhsFormatter)(const void*),
                               const char *(*rhsFormatter)(const void*),
                               const char *lhsExpr, const char *rhsExpr,
                               QTest::ComparisonOperation op, const char *file, int line,
                               const char *failureMessage)
{
    Q_DECL_UNINITIALIZED char msg[maxMsgLen];
    msg[0] = '\0';

    QTEST_ASSERT(lhsExpr);
    QTEST_ASSERT(rhsExpr);

    if (QTestLog::verboseLevel() >= 2) {
        std::snprintf(msg, maxMsgLen, "%s(%s, %s)", macroNameForOp(op), lhsExpr, rhsExpr);
        QTestLog::info(msg, file, line);
    }

    if (success) {
        if (QTest::expectFailMode) {
            std::snprintf(msg, maxMsgLen, "%s(%s, %s) returned TRUE unexpectedly.",
                          macroNameForOp(op), lhsExpr, rhsExpr);
        }
        return checkStatement(success, msg, file, line);
    }

    const std::unique_ptr<const char[]> lhsPtr{ lhsFormatter(lhs) };
    const std::unique_ptr<const char[]> rhsPtr{ rhsFormatter(rhs) };

    if (!failureMessage)
        failureMessage = failureMessageForOp(op);

    formatFailMessage(msg, maxMsgLen, failureMessage, lhsPtr.get(), rhsPtr.get(),
                      lhsExpr, rhsExpr, op);

    return checkStatement(success, msg, file, line);
}